

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_psadbw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  MMXReg MVar9;
  uint val;
  MMXReg *s_local;
  MMXReg *d_local;
  CPUX86State *env_local;
  
  iVar1 = abs1((uint)d->_b_MMXReg[0] - (uint)s->_b_MMXReg[0]);
  iVar2 = abs1((uint)d->_b_MMXReg[1] - (uint)s->_b_MMXReg[1]);
  iVar3 = abs1((uint)d->_b_MMXReg[2] - (uint)s->_b_MMXReg[2]);
  iVar4 = abs1((uint)d->_b_MMXReg[3] - (uint)s->_b_MMXReg[3]);
  iVar5 = abs1((uint)d->_b_MMXReg[4] - (uint)s->_b_MMXReg[4]);
  iVar6 = abs1((uint)d->_b_MMXReg[5] - (uint)s->_b_MMXReg[5]);
  iVar7 = abs1((uint)d->_b_MMXReg[6] - (uint)s->_b_MMXReg[6]);
  iVar8 = abs1((uint)d->_b_MMXReg[7] - (uint)s->_b_MMXReg[7]);
  MVar9._l_MMXReg[1] = 0;
  MVar9._l_MMXReg[0] = iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
  *d = MVar9;
  return;
}

Assistant:

void glue(helper_psadbw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    unsigned int val;

    val = 0;
    val += abs1(d->B(0) - s->B(0));
    val += abs1(d->B(1) - s->B(1));
    val += abs1(d->B(2) - s->B(2));
    val += abs1(d->B(3) - s->B(3));
    val += abs1(d->B(4) - s->B(4));
    val += abs1(d->B(5) - s->B(5));
    val += abs1(d->B(6) - s->B(6));
    val += abs1(d->B(7) - s->B(7));
    d->Q(0) = val;
#if SHIFT == 1
    val = 0;
    val += abs1(d->B(8) - s->B(8));
    val += abs1(d->B(9) - s->B(9));
    val += abs1(d->B(10) - s->B(10));
    val += abs1(d->B(11) - s->B(11));
    val += abs1(d->B(12) - s->B(12));
    val += abs1(d->B(13) - s->B(13));
    val += abs1(d->B(14) - s->B(14));
    val += abs1(d->B(15) - s->B(15));
    d->Q(1) = val;
#endif
}